

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O0

ssize_t __thiscall tcu::LogImage::write(LogImage *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  TextureFormat *pTVar2;
  char *pcVar3;
  char *pcVar4;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t sVar5;
  undefined4 in_register_00000034;
  TestLog *this_00;
  Vector<float,_4> local_a8;
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  Vector<float,_4> local_78;
  undefined1 local_68 [8];
  ConstPixelBufferAccess stencilAccess;
  ConstPixelBufferAccess depthAccess;
  TestLog *log_local;
  LogImage *this_local;
  
  this_00 = (TestLog *)CONCAT44(in_register_00000034,__fd);
  pTVar2 = ConstPixelBufferAccess::getFormat(&this->m_access);
  if (pTVar2->order == DS) {
    getEffectiveDepthStencilAccess
              ((ConstPixelBufferAccess *)&stencilAccess.m_data,&this->m_access,MODE_DEPTH);
    getEffectiveDepthStencilAccess((ConstPixelBufferAccess *)local_68,&this->m_access,MODE_STENCIL);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    TestLog::startImageSet(this_00,pcVar3,pcVar4);
    iVar1 = (int)this;
    Vector<float,_4>::swizzle(&local_78,iVar1 + 0x68,0,0,0);
    Vector<float,_4>::swizzle(&local_88,iVar1 + 0x78,0,0,0);
    TestLog::writeImage(this_00,"Depth","Depth channel",
                        (ConstPixelBufferAccess *)&stencilAccess.m_data,&local_78,&local_88,
                        this->m_compression);
    Vector<float,_4>::swizzle(&local_98,iVar1 + 0x68,1,1,1);
    Vector<float,_4>::swizzle(&local_a8,iVar1 + 0x78,1,1,1);
    TestLog::writeImage(this_00,"Stencil","Stencil channel",(ConstPixelBufferAccess *)local_68,
                        &local_98,&local_a8,this->m_compression);
    TestLog::endImageSet(this_00);
    sVar5 = extraout_RAX_00;
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    TestLog::writeImage(this_00,pcVar3,pcVar4,&this->m_access,&this->m_scale,&this->m_bias,
                        this->m_compression);
    sVar5 = extraout_RAX;
  }
  return sVar5;
}

Assistant:

void LogImage::write (TestLog& log) const
{
	if (m_access.getFormat().order != tcu::TextureFormat::DS)
		log.writeImage(m_name.c_str(), m_description.c_str(), m_access, m_scale, m_bias, m_compression);
	else
	{
		const ConstPixelBufferAccess	depthAccess		= tcu::getEffectiveDepthStencilAccess(m_access, tcu::Sampler::MODE_DEPTH);
		const ConstPixelBufferAccess	stencilAccess	= tcu::getEffectiveDepthStencilAccess(m_access, tcu::Sampler::MODE_STENCIL);

		log.startImageSet(m_name.c_str(), m_description.c_str());
		log.writeImage("Depth", "Depth channel", depthAccess, m_scale.swizzle(0, 0, 0, 0), m_bias.swizzle(0, 0, 0, 0), m_compression);
		log.writeImage("Stencil", "Stencil channel", stencilAccess, m_scale.swizzle(1, 1, 1, 1), m_bias.swizzle(1, 1, 1, 1), m_compression);
		log.endImageSet();
	}
}